

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h8_w16_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 *puVar44;
  ushort uVar45;
  long in_RDI;
  s16 tmp [128];
  __m128i min_val_1;
  __m128i max_val_1;
  __m128i zero;
  __m128i offset_1;
  __m128i t3_1;
  __m128i t2_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i eo1_1;
  __m128i eo0_1;
  __m128i ee1_1;
  __m128i ee0_1;
  __m128i o3_1;
  __m128i o2_1;
  __m128i o1_1;
  __m128i o0_1;
  __m128i e3_1;
  __m128i e2_1;
  __m128i e1_1;
  __m128i e0_1;
  __m128i s7_1;
  __m128i s6_1;
  __m128i s5_1;
  __m128i s4_1;
  __m128i s3_1;
  __m128i s2_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i coeff_p17_n42_1;
  __m128i coeff_p42_p17_1;
  __m128i coeff_p32_n32_1;
  __m128i coeff_p32_p32_1;
  __m128i coeff_p38_n44_1;
  __m128i coeff_p9_n25_1;
  __m128i coeff_p9_p38_1;
  __m128i coeff_p25_n44_1;
  __m128i coeff_n44_n25_1;
  __m128i coeff_p38_n9_1;
  __m128i coeff_p25_p9_1;
  __m128i coeff_p44_p38_1;
  __m256i min_val;
  __m256i max_val;
  int i_src7;
  int i_src6;
  int i_src5;
  int i_src4;
  int i_src3;
  int i_src2;
  int j;
  __m256i offset;
  __m256i d7;
  __m256i d6;
  __m256i d5;
  __m256i d4;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i eo1;
  __m256i eo0;
  __m256i ee1;
  __m256i ee0;
  __m256i o3;
  __m256i o2;
  __m256i o1;
  __m256i o0;
  __m256i e3;
  __m256i e2;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m256i coeff_p17_n42;
  __m256i coeff_p42_p17;
  __m256i coeff_p32_n32;
  __m256i coeff_p32_p32;
  __m256i coeff_p38_n44;
  __m256i coeff_p9_n25;
  __m256i coeff_p9_p38;
  __m256i coeff_p25_n44;
  __m256i coeff_n44_n25;
  __m256i coeff_p38_n9;
  __m256i coeff_p25_p9;
  __m256i coeff_p44_p38;
  undefined8 local_2d00 [116];
  undefined1 local_2960 [16];
  undefined1 auStackY_2950 [16];
  undefined8 local_2940;
  undefined8 uStackY_2938;
  undefined8 uStackY_2930;
  undefined8 uStackY_2928;
  int local_291c;
  int local_2918;
  int local_2914;
  int local_2910;
  int local_290c;
  int local_2908;
  int local_2904;
  undefined1 local_2900 [16];
  undefined1 auStackY_28f0 [16];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [24];
  s16 *psStackY_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined8 local_25a0;
  undefined8 uStackY_2598;
  undefined8 local_2590;
  undefined8 uStackY_2588;
  undefined8 local_2580;
  undefined8 uStackY_2578;
  undefined8 local_2570;
  undefined8 uStackY_2568;
  undefined8 local_2560;
  undefined8 uStackY_2558;
  undefined8 local_2550;
  undefined8 uStackY_2548;
  undefined8 local_2540;
  undefined8 uStackY_2538;
  undefined8 local_2530;
  undefined8 uStackY_2528;
  undefined8 local_2520;
  undefined8 uStackY_2518;
  undefined8 uStackY_2510;
  undefined8 uStackY_2508;
  undefined8 local_2500;
  undefined8 uStackY_24f8;
  undefined8 uStackY_24f0;
  undefined8 uStackY_24e8;
  undefined8 local_24e0;
  undefined8 uStackY_24d8;
  undefined8 uStackY_24d0;
  undefined8 uStackY_24c8;
  undefined8 local_24c0;
  undefined8 uStackY_24b8;
  undefined8 uStackY_24b0;
  undefined8 uStackY_24a8;
  undefined8 local_24a0;
  undefined8 uStackY_2498;
  undefined8 uStackY_2490;
  undefined8 uStackY_2488;
  undefined8 local_2480;
  undefined8 uStackY_2478;
  undefined8 uStackY_2470;
  undefined8 uStackY_2468;
  undefined8 local_2460;
  undefined8 uStackY_2458;
  undefined8 uStackY_2450;
  undefined8 uStackY_2448;
  undefined8 local_2440;
  undefined8 uStackY_2438;
  undefined8 uStackY_2430;
  undefined8 uStackY_2428;
  undefined8 local_2420;
  undefined8 uStackY_2418;
  undefined8 uStackY_2410;
  undefined8 uStackY_2408;
  undefined8 local_2400;
  undefined8 uStackY_23f8;
  undefined8 uStackY_23f0;
  undefined8 uStackY_23e8;
  undefined8 local_23e0;
  undefined8 uStackY_23d8;
  undefined8 uStackY_23d0;
  undefined8 uStackY_23c8;
  undefined8 local_23c0;
  undefined8 uStackY_23b8;
  undefined8 uStackY_23b0;
  undefined8 uStackY_23a8;
  int local_239c;
  uint local_2398;
  int local_2394;
  undefined8 *local_2390;
  int local_2384;
  long local_2380;
  undefined4 local_2374;
  undefined4 local_2370;
  undefined4 local_236c;
  undefined4 local_2368;
  undefined4 local_2364;
  undefined4 local_2360;
  undefined4 local_235c;
  undefined4 local_2358;
  undefined4 local_2354;
  undefined4 local_2350;
  undefined4 local_234c;
  undefined4 local_2348;
  undefined4 local_2344;
  undefined1 (*local_2340) [16];
  undefined1 (*local_2338) [16];
  undefined1 (*local_2330) [16];
  undefined1 (*local_2328) [16];
  undefined1 (*local_2320) [16];
  undefined1 (*local_2318) [16];
  undefined1 (*local_2310) [16];
  undefined1 (*local_2308) [16];
  undefined8 local_2180;
  undefined8 uStackY_2178;
  undefined8 local_2170;
  undefined8 uStackY_2168;
  undefined8 local_2160;
  undefined8 uStackY_2158;
  undefined8 local_2150;
  undefined8 uStackY_2148;
  undefined8 local_2140;
  undefined8 uStackY_2138;
  undefined8 local_2130;
  undefined8 uStackY_2128;
  undefined8 local_2120;
  undefined8 uStackY_2118;
  undefined8 local_2110;
  undefined8 uStackY_2108;
  undefined8 local_2080;
  undefined8 uStackY_2078;
  undefined8 local_2070;
  undefined8 uStackY_2068;
  undefined8 local_2060;
  undefined8 uStackY_2058;
  undefined8 local_2050;
  undefined8 uStackY_2048;
  undefined8 local_2040;
  undefined8 uStackY_2038;
  undefined8 local_2030;
  undefined8 uStackY_2028;
  undefined8 local_2020;
  undefined8 uStackY_2018;
  undefined8 local_2010;
  undefined8 uStackY_2008;
  undefined8 local_2000;
  undefined8 uStackY_1ff8;
  undefined8 local_1ff0;
  undefined8 uStackY_1fe8;
  undefined8 local_1fe0;
  undefined8 uStackY_1fd8;
  undefined8 local_1fd0;
  undefined8 uStackY_1fc8;
  undefined8 local_1fc0;
  undefined8 uStackY_1fb8;
  undefined8 uStackY_1fb0;
  undefined8 uStackY_1fa8;
  undefined8 local_1fa0;
  undefined8 uStackY_1f98;
  undefined8 uStackY_1f90;
  undefined8 uStackY_1f88;
  undefined8 local_1f80;
  undefined8 uStackY_1f78;
  undefined8 uStackY_1f70;
  undefined8 uStackY_1f68;
  undefined8 local_1f60;
  undefined8 uStackY_1f58;
  undefined8 uStackY_1f50;
  undefined8 uStackY_1f48;
  undefined8 local_1f40;
  undefined8 uStackY_1f38;
  undefined8 uStackY_1f30;
  undefined8 uStackY_1f28;
  undefined8 local_1f20;
  undefined8 uStackY_1f18;
  undefined8 uStackY_1f10;
  undefined8 uStackY_1f08;
  undefined8 local_1f00;
  undefined8 uStackY_1ef8;
  undefined8 uStackY_1ef0;
  undefined8 uStackY_1ee8;
  undefined8 local_1ee0;
  undefined8 uStackY_1ed8;
  undefined8 uStackY_1ed0;
  undefined8 uStackY_1ec8;
  undefined8 local_1ec0;
  undefined8 uStackY_1eb8;
  undefined8 uStackY_1eb0;
  undefined8 uStackY_1ea8;
  undefined8 local_1ea0;
  undefined8 uStackY_1e98;
  undefined8 uStackY_1e90;
  undefined8 uStackY_1e88;
  undefined8 local_1e80;
  undefined8 uStackY_1e78;
  undefined8 uStackY_1e70;
  undefined8 uStackY_1e68;
  undefined8 local_1e60;
  undefined8 uStackY_1e58;
  undefined8 uStackY_1e50;
  undefined8 uStackY_1e48;
  undefined8 local_1e40;
  undefined8 uStackY_1e38;
  undefined8 uStackY_1e30;
  undefined8 uStackY_1e28;
  undefined8 local_1e20;
  undefined8 uStackY_1e18;
  undefined8 uStackY_1e10;
  undefined8 uStackY_1e08;
  undefined8 local_1e00;
  undefined8 uStackY_1df8;
  undefined8 uStackY_1df0;
  undefined8 uStackY_1de8;
  undefined8 local_1de0;
  undefined8 uStackY_1dd8;
  undefined8 uStackY_1dd0;
  undefined8 uStackY_1dc8;
  undefined8 local_1dc0;
  undefined8 uStackY_1db8;
  undefined8 uStackY_1db0;
  undefined8 uStackY_1da8;
  undefined8 local_1da0;
  undefined8 uStackY_1d98;
  undefined8 uStackY_1d90;
  undefined8 uStackY_1d88;
  undefined8 local_1d80;
  undefined8 uStackY_1d78;
  undefined8 uStackY_1d70;
  undefined8 uStackY_1d68;
  undefined8 local_1d60;
  undefined8 uStackY_1d58;
  undefined8 uStackY_1d50;
  undefined8 uStackY_1d48;
  undefined8 local_1d40;
  undefined8 uStackY_1d38;
  undefined8 uStackY_1d30;
  undefined8 uStackY_1d28;
  undefined8 local_1d20;
  undefined8 uStackY_1d18;
  undefined8 uStackY_1d10;
  undefined8 uStackY_1d08;
  undefined8 local_1d00;
  undefined8 uStackY_1cf8;
  undefined8 uStackY_1cf0;
  undefined8 uStackY_1ce8;
  undefined8 local_1ce0;
  undefined8 uStackY_1cd8;
  undefined8 uStackY_1cd0;
  undefined8 uStackY_1cc8;
  undefined8 local_1cc0;
  undefined8 uStackY_1cb8;
  undefined8 uStackY_1cb0;
  undefined8 uStackY_1ca8;
  undefined8 local_1ca0;
  undefined8 uStackY_1c98;
  undefined8 uStackY_1c90;
  undefined8 uStackY_1c88;
  undefined8 local_1c80;
  undefined8 uStackY_1c78;
  undefined8 uStackY_1c70;
  undefined8 uStackY_1c68;
  undefined8 local_1c60;
  undefined8 uStackY_1c58;
  undefined8 uStackY_1c50;
  undefined8 uStackY_1c48;
  undefined8 local_1c40;
  undefined8 uStackY_1c38;
  undefined8 uStackY_1c30;
  undefined8 uStackY_1c28;
  undefined8 local_1c20;
  undefined8 uStackY_1c18;
  undefined8 uStackY_1c10;
  undefined4 uStackY_1c08;
  int in_stack_ffffffffffffe3fc;
  int in_stack_ffffffffffffe400;
  int in_stack_ffffffffffffe404;
  s16 *in_stack_ffffffffffffe408;
  int in_stack_ffffffffffffe414;
  s16 *in_stack_ffffffffffffe418;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  
  local_2390 = local_2d00;
  local_2384 = 0x10;
  local_2394 = 0x10;
  local_2398 = 5;
  local_239c = 0xf;
  local_2344 = 0x26002c;
  auVar1 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,2);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar2 = vpinsrd_avx(auVar2,0x26002c,2);
  auVar2 = vpinsrd_avx(auVar2,0x26002c,3);
  local_ba0 = auVar1._0_8_;
  uStack_b98 = auVar1._8_8_;
  uStack_b90 = auVar2._0_8_;
  uStack_b88 = auVar2._8_8_;
  local_23c0 = local_ba0;
  uStackY_23b8 = uStack_b98;
  uStackY_23b0 = uStack_b90;
  uStackY_23a8 = uStack_b88;
  local_2348 = 0x90019;
  auVar1 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar1 = vpinsrd_avx(auVar1,0x90019,2);
  auVar1 = vpinsrd_avx(auVar1,0x90019,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar2 = vpinsrd_avx(auVar2,0x90019,2);
  auVar2 = vpinsrd_avx(auVar2,0x90019,3);
  local_be0 = auVar1._0_8_;
  uStack_bd8 = auVar1._8_8_;
  uStack_bd0 = auVar2._0_8_;
  uStack_bc8 = auVar2._8_8_;
  local_23e0 = local_be0;
  uStackY_23d8 = uStack_bd8;
  uStackY_23d0 = uStack_bd0;
  uStackY_23c8 = uStack_bc8;
  local_234c = 0xfff70026;
  auVar1 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar1 = vpinsrd_avx(auVar1,0xfff70026,2);
  auVar1 = vpinsrd_avx(auVar1,0xfff70026,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar2 = vpinsrd_avx(auVar2,0xfff70026,2);
  auVar2 = vpinsrd_avx(auVar2,0xfff70026,3);
  local_c20 = auVar1._0_8_;
  uStack_c18 = auVar1._8_8_;
  uStack_c10 = auVar2._0_8_;
  uStack_c08 = auVar2._8_8_;
  local_2400 = local_c20;
  uStackY_23f8 = uStack_c18;
  uStackY_23f0 = uStack_c10;
  uStackY_23e8 = uStack_c08;
  local_2350 = 0xffe7ffd4;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe7ffd4,2);
  auVar1 = vpinsrd_avx(auVar1,0xffe7ffd4,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar2 = vpinsrd_avx(auVar2,0xffe7ffd4,2);
  auVar2 = vpinsrd_avx(auVar2,0xffe7ffd4,3);
  local_c60 = auVar1._0_8_;
  uStack_c58 = auVar1._8_8_;
  uStack_c50 = auVar2._0_8_;
  uStack_c48 = auVar2._8_8_;
  local_2420 = local_c60;
  uStackY_2418 = uStack_c58;
  uStackY_2410 = uStack_c50;
  uStackY_2408 = uStack_c48;
  local_2354 = 0xffd40019;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40019,2);
  auVar1 = vpinsrd_avx(auVar1,0xffd40019,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar2 = vpinsrd_avx(auVar2,0xffd40019,2);
  auVar2 = vpinsrd_avx(auVar2,0xffd40019,3);
  local_ca0 = auVar1._0_8_;
  uStack_c98 = auVar1._8_8_;
  uStack_c90 = auVar2._0_8_;
  uStack_c88 = auVar2._8_8_;
  local_2440 = local_ca0;
  uStackY_2438 = uStack_c98;
  uStackY_2430 = uStack_c90;
  uStackY_2428 = uStack_c88;
  local_2358 = 0x260009;
  auVar1 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar1 = vpinsrd_avx(auVar1,0x260009,2);
  auVar1 = vpinsrd_avx(auVar1,0x260009,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar2 = vpinsrd_avx(auVar2,0x260009,2);
  auVar2 = vpinsrd_avx(auVar2,0x260009,3);
  local_ce0 = auVar1._0_8_;
  uStack_cd8 = auVar1._8_8_;
  uStack_cd0 = auVar2._0_8_;
  uStack_cc8 = auVar2._8_8_;
  local_2460 = local_ce0;
  uStackY_2458 = uStack_cd8;
  uStackY_2450 = uStack_cd0;
  uStackY_2448 = uStack_cc8;
  local_235c = 0xffe70009;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe70009,2);
  auVar1 = vpinsrd_avx(auVar1,0xffe70009,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar2 = vpinsrd_avx(auVar2,0xffe70009,2);
  auVar2 = vpinsrd_avx(auVar2,0xffe70009,3);
  local_d20 = auVar1._0_8_;
  uStack_d18 = auVar1._8_8_;
  uStack_d10 = auVar2._0_8_;
  uStack_d08 = auVar2._8_8_;
  local_2480 = local_d20;
  uStackY_2478 = uStack_d18;
  uStackY_2470 = uStack_d10;
  uStackY_2468 = uStack_d08;
  local_2360 = 0xffd40026;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd40026,2);
  auVar1 = vpinsrd_avx(auVar1,0xffd40026,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar2 = vpinsrd_avx(auVar2,0xffd40026,2);
  auVar2 = vpinsrd_avx(auVar2,0xffd40026,3);
  local_d60 = auVar1._0_8_;
  uStack_d58 = auVar1._8_8_;
  uStack_d50 = auVar2._0_8_;
  uStack_d48 = auVar2._8_8_;
  local_24a0 = local_d60;
  uStackY_2498 = uStack_d58;
  uStackY_2490 = uStack_d50;
  uStackY_2488 = uStack_d48;
  local_2364 = 0x200020;
  auVar1 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar1 = vpinsrd_avx(auVar1,0x200020,2);
  auVar1 = vpinsrd_avx(auVar1,0x200020,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar2 = vpinsrd_avx(auVar2,0x200020,2);
  auVar2 = vpinsrd_avx(auVar2,0x200020,3);
  local_da0 = auVar1._0_8_;
  uStack_d98 = auVar1._8_8_;
  uStack_d90 = auVar2._0_8_;
  uStack_d88 = auVar2._8_8_;
  local_24c0 = local_da0;
  uStackY_24b8 = uStack_d98;
  uStackY_24b0 = uStack_d90;
  uStackY_24a8 = uStack_d88;
  local_2368 = 0xffe00020;
  auVar1 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,2);
  auVar1 = vpinsrd_avx(auVar1,0xffe00020,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar2 = vpinsrd_avx(auVar2,0xffe00020,2);
  auVar2 = vpinsrd_avx(auVar2,0xffe00020,3);
  local_de0 = auVar1._0_8_;
  uStack_dd8 = auVar1._8_8_;
  uStack_dd0 = auVar2._0_8_;
  uStack_dc8 = auVar2._8_8_;
  local_24e0 = local_de0;
  uStackY_24d8 = uStack_dd8;
  uStackY_24d0 = uStack_dd0;
  uStackY_24c8 = uStack_dc8;
  local_236c = 0x11002a;
  auVar1 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,2);
  auVar1 = vpinsrd_avx(auVar1,0x11002a,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar2 = vpinsrd_avx(auVar2,0x11002a,2);
  auVar2 = vpinsrd_avx(auVar2,0x11002a,3);
  local_e20 = auVar1._0_8_;
  uStack_e18 = auVar1._8_8_;
  uStack_e10 = auVar2._0_8_;
  uStack_e08 = auVar2._8_8_;
  local_2500 = local_e20;
  uStackY_24f8 = uStack_e18;
  uStackY_24f0 = uStack_e10;
  uStackY_24e8 = uStack_e08;
  local_2370 = 0xffd60011;
  auVar1 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,2);
  auVar1 = vpinsrd_avx(auVar1,0xffd60011,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar2 = vpinsrd_avx(auVar2,0xffd60011,2);
  auVar2 = vpinsrd_avx(auVar2,0xffd60011,3);
  local_e60 = auVar1._0_8_;
  uStack_e58 = auVar1._8_8_;
  uStack_e50 = auVar2._0_8_;
  uStack_e48 = auVar2._8_8_;
  local_2520 = local_e60;
  uStackY_2518 = uStack_e58;
  uStackY_2510 = uStack_e50;
  uStackY_2508 = uStack_e48;
  local_2374 = 0x10;
  auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar1 = vpinsrd_avx(auVar1,0x10,2);
  auVar1 = vpinsrd_avx(auVar1,0x10,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  local_2900 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auStackY_28f0 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_2908 = 0x20;
  local_290c = 0x30;
  local_2910 = 0x40;
  local_2914 = 0x50;
  local_2918 = 0x60;
  local_291c = 0x70;
  local_2904 = 0;
  local_2380 = in_RDI;
  while( true ) {
    puVar44 = local_2390;
    if (local_2394 <= local_2904) break;
    local_2308 = (undefined1 (*) [16])(local_2380 + (long)local_2384 * 2 + (long)local_2904 * 2);
    local_2540 = *(undefined8 *)*local_2308;
    uStackY_2538 = *(undefined8 *)(*local_2308 + 8);
    local_2310 = (undefined1 (*) [16])(local_2380 + (long)local_290c * 2 + (long)local_2904 * 2);
    local_2560 = *(undefined8 *)*local_2310;
    uStackY_2558 = *(undefined8 *)(*local_2310 + 8);
    local_2318 = (undefined1 (*) [16])(local_2380 + (long)local_2914 * 2 + (long)local_2904 * 2);
    local_2580 = *(undefined8 *)*local_2318;
    uStackY_2578 = *(undefined8 *)(*local_2318 + 8);
    local_2320 = (undefined1 (*) [16])(local_2380 + (long)local_291c * 2 + (long)local_2904 * 2);
    local_25a0 = *(undefined8 *)*local_2320;
    uStackY_2598 = *(undefined8 *)(*local_2320 + 8);
    auVar3 = vpunpcklwd_avx(*local_2308,*local_2310);
    auVar1 = vpunpckhwd_avx(*local_2308,*local_2310);
    auVar4 = vpunpcklwd_avx(*local_2318,*local_2320);
    auVar2 = vpunpckhwd_avx(*local_2318,*local_2320);
    local_25b0._0_8_ = auVar3._0_8_;
    local_25b0._8_8_ = auVar3._8_8_;
    local_1fd0 = local_25b0._0_8_;
    uStackY_1fc8 = local_25b0._8_8_;
    local_25c0._0_8_ = auVar1._0_8_;
    local_25c0._8_8_ = auVar1._8_8_;
    local_25d0._0_8_ = auVar4._0_8_;
    local_25d0._8_8_ = auVar4._8_8_;
    local_1fe0 = local_25d0._0_8_;
    uStackY_1fd8 = local_25d0._8_8_;
    local_25e0._0_8_ = auVar2._0_8_;
    local_25e0._8_8_ = auVar2._8_8_;
    local_1ce0 = local_25b0._0_8_;
    uStackY_1cd8 = local_25b0._8_8_;
    uStackY_1cd0 = local_25c0._0_8_;
    uStackY_1cc8 = local_25c0._8_8_;
    local_1d00 = local_23c0;
    uStackY_1cf8 = uStackY_23b8;
    uStackY_1cf0 = uStackY_23b0;
    uStackY_1ce8 = uStackY_23a8;
    auVar28._16_8_ = local_25c0._0_8_;
    auVar28._0_16_ = auVar3;
    auVar28._24_8_ = local_25c0._8_8_;
    auVar27._8_8_ = uStackY_23b8;
    auVar27._0_8_ = local_23c0;
    auVar27._16_8_ = uStackY_23b0;
    auVar27._24_8_ = uStackY_23a8;
    auVar5 = vpmaddwd_avx2(auVar28,auVar27);
    local_1d20 = local_25d0._0_8_;
    uStackY_1d18 = local_25d0._8_8_;
    uStackY_1d10 = local_25e0._0_8_;
    uStackY_1d08 = local_25e0._8_8_;
    local_1d40 = local_23e0;
    uStackY_1d38 = uStackY_23d8;
    uStackY_1d30 = uStackY_23d0;
    uStackY_1d28 = uStackY_23c8;
    auVar26._16_8_ = local_25e0._0_8_;
    auVar26._0_16_ = auVar4;
    auVar26._24_8_ = local_25e0._8_8_;
    auVar25._8_8_ = uStackY_23d8;
    auVar25._0_8_ = local_23e0;
    auVar25._16_8_ = uStackY_23d0;
    auVar25._24_8_ = uStackY_23c8;
    auVar6 = vpmaddwd_avx2(auVar26,auVar25);
    local_1d60 = local_25b0._0_8_;
    uStackY_1d58 = local_25b0._8_8_;
    uStackY_1d50 = local_25c0._0_8_;
    uStackY_1d48 = local_25c0._8_8_;
    local_1d80 = local_2400;
    uStackY_1d78 = uStackY_23f8;
    uStackY_1d70 = uStackY_23f0;
    uStackY_1d68 = uStackY_23e8;
    auVar24._16_8_ = local_25c0._0_8_;
    auVar24._0_16_ = auVar3;
    auVar24._24_8_ = local_25c0._8_8_;
    auVar23._8_8_ = uStackY_23f8;
    auVar23._0_8_ = local_2400;
    auVar23._16_8_ = uStackY_23f0;
    auVar23._24_8_ = uStackY_23e8;
    auVar7 = vpmaddwd_avx2(auVar24,auVar23);
    local_1da0 = local_25d0._0_8_;
    uStackY_1d98 = local_25d0._8_8_;
    uStackY_1d90 = local_25e0._0_8_;
    uStackY_1d88 = local_25e0._8_8_;
    local_1dc0 = local_2420;
    uStackY_1db8 = uStackY_2418;
    uStackY_1db0 = uStackY_2410;
    uStackY_1da8 = uStackY_2408;
    auVar22._16_8_ = local_25e0._0_8_;
    auVar22._0_16_ = auVar4;
    auVar22._24_8_ = local_25e0._8_8_;
    auVar21._8_8_ = uStackY_2418;
    auVar21._0_8_ = local_2420;
    auVar21._16_8_ = uStackY_2410;
    auVar21._24_8_ = uStackY_2408;
    auVar8 = vpmaddwd_avx2(auVar22,auVar21);
    _local_2680 = vpaddd_avx2(auVar5,auVar6);
    local_26a0 = vpaddd_avx2(auVar7,auVar8);
    local_1de0 = local_25b0._0_8_;
    uStackY_1dd8 = local_25b0._8_8_;
    uStackY_1dd0 = local_25c0._0_8_;
    uStackY_1dc8 = local_25c0._8_8_;
    local_1e00 = local_2440;
    uStackY_1df8 = uStackY_2438;
    uStackY_1df0 = uStackY_2430;
    uStackY_1de8 = uStackY_2428;
    auVar20._16_8_ = local_25c0._0_8_;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = local_25c0._8_8_;
    auVar19._8_8_ = uStackY_2438;
    auVar19._0_8_ = local_2440;
    auVar19._16_8_ = uStackY_2430;
    auVar19._24_8_ = uStackY_2428;
    local_2780 = vpmaddwd_avx2(auVar20,auVar19);
    local_1e20 = local_25d0._0_8_;
    uStackY_1e18 = local_25d0._8_8_;
    uStackY_1e10 = local_25e0._0_8_;
    uStackY_1e08 = local_25e0._8_8_;
    local_1e40 = local_2460;
    uStackY_1e38 = uStackY_2458;
    uStackY_1e30 = uStackY_2450;
    uStackY_1e28 = uStackY_2448;
    auVar18._16_8_ = local_25e0._0_8_;
    auVar18._0_16_ = auVar4;
    auVar18._24_8_ = local_25e0._8_8_;
    auVar17._8_8_ = uStackY_2458;
    auVar17._0_8_ = local_2460;
    auVar17._16_8_ = uStackY_2450;
    auVar17._24_8_ = uStackY_2448;
    local_27a0 = vpmaddwd_avx2(auVar18,auVar17);
    local_1e60 = local_25b0._0_8_;
    uStackY_1e58 = local_25b0._8_8_;
    uStackY_1e50 = local_25c0._0_8_;
    uStackY_1e48 = local_25c0._8_8_;
    local_1e80 = local_2480;
    uStackY_1e78 = uStackY_2478;
    uStackY_1e70 = uStackY_2470;
    uStackY_1e68 = uStackY_2468;
    auVar16._16_8_ = local_25c0._0_8_;
    auVar16._0_16_ = auVar3;
    auVar16._24_8_ = local_25c0._8_8_;
    auVar15._8_8_ = uStackY_2478;
    auVar15._0_8_ = local_2480;
    auVar15._16_8_ = uStackY_2470;
    auVar15._24_8_ = uStackY_2468;
    local_27c0 = vpmaddwd_avx2(auVar16,auVar15);
    local_1ea0 = local_25d0._0_8_;
    uStackY_1e98 = local_25d0._8_8_;
    uStackY_1e90 = local_25e0._0_8_;
    uStackY_1e88 = local_25e0._8_8_;
    local_1ec0 = local_24a0;
    uStackY_1eb8 = uStackY_2498;
    uStackY_1eb0 = uStackY_2490;
    uStackY_1ea8 = uStackY_2488;
    auVar14._16_8_ = local_25e0._0_8_;
    auVar14._0_16_ = auVar4;
    auVar14._24_8_ = local_25e0._8_8_;
    auVar13._8_8_ = uStackY_2498;
    auVar13._0_8_ = local_24a0;
    auVar13._16_8_ = uStackY_2490;
    auVar13._24_8_ = uStackY_2488;
    local_27e0 = vpmaddwd_avx2(auVar14,auVar13);
    local_26c0 = vpaddd_avx2(local_2780,local_27a0);
    local_26e0 = vpaddd_avx2(local_27c0,local_27e0);
    local_2328 = (undefined1 (*) [16])(local_2380 + (long)local_2904 * 2);
    local_2530 = *(undefined8 *)*local_2328;
    uStackY_2528 = *(undefined8 *)(*local_2328 + 8);
    local_2330 = (undefined1 (*) [16])(local_2380 + (long)local_2908 * 2 + (long)local_2904 * 2);
    local_2550 = *(undefined8 *)*local_2330;
    uStackY_2548 = *(undefined8 *)(*local_2330 + 8);
    local_2338 = (undefined1 (*) [16])(local_2380 + (long)local_2910 * 2 + (long)local_2904 * 2);
    local_2570 = *(undefined8 *)*local_2338;
    uStackY_2568 = *(undefined8 *)(*local_2338 + 8);
    local_2340 = (undefined1 (*) [16])(local_2380 + (long)local_2918 * 2 + (long)local_2904 * 2);
    local_2590 = *(undefined8 *)*local_2340;
    uStackY_2588 = *(undefined8 *)(*local_2340 + 8);
    local_25b0 = vpunpcklwd_avx(*local_2328,*local_2338);
    local_25c0 = vpunpckhwd_avx(*local_2328,*local_2338);
    local_25d0 = vpunpcklwd_avx(*local_2330,*local_2340);
    local_25e0 = vpunpckhwd_avx(*local_2330,*local_2340);
    local_1ff0 = local_25b0._0_8_;
    uStackY_1fe8 = local_25b0._8_8_;
    local_2000 = local_25d0._0_8_;
    uStackY_1ff8 = local_25d0._8_8_;
    local_1ee0 = local_25b0._0_8_;
    uStackY_1ed8 = local_25b0._8_8_;
    uStackY_1ed0 = local_25c0._0_8_;
    uStackY_1ec8 = local_25c0._8_8_;
    local_1f00 = local_24c0;
    uStackY_1ef8 = uStackY_24b8;
    uStackY_1ef0 = uStackY_24b0;
    uStackY_1ee8 = uStackY_24a8;
    auVar12._16_8_ = local_25c0._0_8_;
    auVar12._0_16_ = local_25b0;
    auVar12._24_8_ = local_25c0._8_8_;
    auVar11._8_8_ = uStackY_24b8;
    auVar11._0_8_ = local_24c0;
    auVar11._16_8_ = uStackY_24b0;
    auVar11._24_8_ = uStackY_24a8;
    local_2700 = vpmaddwd_avx2(auVar12,auVar11);
    local_1f20 = local_25b0._0_8_;
    uStackY_1f18 = local_25b0._8_8_;
    uStackY_1f10 = local_25c0._0_8_;
    uStackY_1f08 = local_25c0._8_8_;
    local_1f40 = local_24e0;
    uStackY_1f38 = uStackY_24d8;
    uStackY_1f30 = uStackY_24d0;
    uStackY_1f28 = uStackY_24c8;
    auVar10._16_8_ = local_25c0._0_8_;
    auVar10._0_16_ = local_25b0;
    auVar10._24_8_ = local_25c0._8_8_;
    auVar9._8_8_ = uStackY_24d8;
    auVar9._0_8_ = local_24e0;
    auVar9._16_8_ = uStackY_24d0;
    auVar9._24_8_ = uStackY_24c8;
    local_2720 = vpmaddwd_avx2(auVar10,auVar9);
    local_1f60 = local_25d0._0_8_;
    uStackY_1f58 = local_25d0._8_8_;
    uStackY_1f50 = local_25e0._0_8_;
    uStackY_1f48 = local_25e0._8_8_;
    local_1f80 = local_2500;
    uStackY_1f78 = uStackY_24f8;
    uStackY_1f70 = uStackY_24f0;
    uStackY_1f68 = uStackY_24e8;
    auVar8._16_8_ = local_25e0._0_8_;
    auVar8._0_16_ = local_25d0;
    auVar8._24_8_ = local_25e0._8_8_;
    auVar7._8_8_ = uStackY_24f8;
    auVar7._0_8_ = local_2500;
    auVar7._16_8_ = uStackY_24f0;
    auVar7._24_8_ = uStackY_24e8;
    local_2740 = vpmaddwd_avx2(auVar8,auVar7);
    local_1fa0 = local_25d0._0_8_;
    uStackY_1f98 = local_25d0._8_8_;
    uStackY_1f90 = local_25e0._0_8_;
    uStackY_1f88 = local_25e0._8_8_;
    local_1fc0 = local_2520;
    uStackY_1fb8 = uStackY_2518;
    uStackY_1fb0 = uStackY_2510;
    uStackY_1fa8 = uStackY_2508;
    auVar6._16_8_ = local_25e0._0_8_;
    auVar6._0_16_ = local_25d0;
    auVar6._24_8_ = local_25e0._8_8_;
    auVar5._8_8_ = uStackY_2518;
    auVar5._0_8_ = local_2520;
    auVar5._16_8_ = uStackY_2510;
    auVar5._24_8_ = uStackY_2508;
    local_2760 = vpmaddwd_avx2(auVar6,auVar5);
    auVar5 = vpaddd_avx2(local_2700,local_2740);
    auVar7 = vpsubd_avx2(local_2700,local_2740);
    auVar6 = vpaddd_avx2(local_2720,local_2760);
    auVar8 = vpsubd_avx2(local_2720,local_2760);
    auVar32._16_8_ = auStackY_28f0._0_8_;
    auVar32._0_16_ = local_2900;
    auVar32._24_8_ = auStackY_28f0._8_8_;
    local_2600 = vpaddd_avx2(auVar5,auVar32);
    auVar31._16_8_ = auStackY_28f0._0_8_;
    auVar31._0_16_ = local_2900;
    auVar31._24_8_ = auStackY_28f0._8_8_;
    local_2660 = vpaddd_avx2(auVar7,auVar31);
    auVar30._16_8_ = auStackY_28f0._0_8_;
    auVar30._0_16_ = local_2900;
    auVar30._24_8_ = auStackY_28f0._8_8_;
    local_2620 = vpaddd_avx2(auVar6,auVar30);
    auVar29._16_8_ = auStackY_28f0._0_8_;
    auVar29._0_16_ = local_2900;
    auVar29._24_8_ = auStackY_28f0._8_8_;
    local_2640 = vpaddd_avx2(auVar8,auVar29);
    in_stack_ffffffffffffe408 = (s16 *)local_2680._8_8_;
    in_stack_ffffffffffffe418 = psStackY_2668;
    in_stack_ffffffffffffe400 = local_2680._0_4_;
    in_stack_ffffffffffffe404 = local_2680._4_4_;
    in_stack_ffffffffffffe414 = local_2680._20_4_;
    auVar5 = vpaddd_avx2(local_2600,_local_2680);
    auVar9 = vpsubd_avx2(local_2600,_local_2680);
    local_1c20 = local_2620._0_8_;
    uStackY_1c18 = local_2620._8_8_;
    uStackY_1c10 = local_2620._16_8_;
    uStackY_1c08 = local_2620._24_4_;
    in_stack_ffffffffffffe3fc = local_2620._28_4_;
    local_1c40 = local_26a0._0_8_;
    uStackY_1c38 = local_26a0._8_8_;
    uStackY_1c30 = local_26a0._16_8_;
    uStackY_1c28 = local_26a0._24_8_;
    auVar6 = vpaddd_avx2(local_2620,local_26a0);
    auVar10 = vpsubd_avx2(local_2620,local_26a0);
    local_1c60 = local_2640._0_8_;
    uStackY_1c58 = local_2640._8_8_;
    uStackY_1c50 = local_2640._16_8_;
    uStackY_1c48 = local_2640._24_8_;
    local_1c80 = local_26c0._0_8_;
    uStackY_1c78 = local_26c0._8_8_;
    uStackY_1c70 = local_26c0._16_8_;
    uStackY_1c68 = local_26c0._24_8_;
    auVar7 = vpaddd_avx2(local_2640,local_26c0);
    auVar11 = vpsubd_avx2(local_2640,local_26c0);
    local_1ca0 = local_2660._0_8_;
    uStackY_1c98 = local_2660._8_8_;
    uStackY_1c90 = local_2660._16_8_;
    uStackY_1c88 = local_2660._24_8_;
    local_1cc0 = local_26e0._0_8_;
    uStackY_1cb8 = local_26e0._8_8_;
    uStackY_1cb0 = local_26e0._16_8_;
    uStackY_1ca8 = local_26e0._24_8_;
    auVar8 = vpaddd_avx2(local_2660,local_26e0);
    auVar12 = vpsubd_avx2(local_2660,local_26e0);
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(local_2398));
    auVar9 = vpsrad_avx2(auVar9,ZEXT416(local_2398));
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(local_2398));
    auVar10 = vpsrad_avx2(auVar10,ZEXT416(local_2398));
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(local_2398));
    auVar11 = vpsrad_avx2(auVar11,ZEXT416(local_2398));
    auVar8 = vpsrad_avx2(auVar8,ZEXT416(local_2398));
    auVar12 = vpsrad_avx2(auVar12,ZEXT416(local_2398));
    auVar5 = vpackssdw_avx2(auVar5,auVar12);
    auVar6 = vpackssdw_avx2(auVar6,auVar11);
    auVar7 = vpackssdw_avx2(auVar7,auVar10);
    auVar8 = vpackssdw_avx2(auVar8,auVar9);
    auVar9 = vpunpcklwd_avx2(auVar5,auVar7);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar7);
    auVar7 = vpunpcklwd_avx2(auVar6,auVar8);
    auVar6 = vpunpckhwd_avx2(auVar6,auVar8);
    auVar8 = vpunpcklwd_avx2(auVar9,auVar7);
    auVar7 = vpunpckhwd_avx2(auVar9,auVar7);
    auVar9 = vpunpcklwd_avx2(auVar5,auVar6);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
    local_2880 = vpunpcklqdq_avx2(auVar8,auVar9);
    local_28a0 = vpunpckhqdq_avx2(auVar8,auVar9);
    local_28c0 = vpunpcklqdq_avx2(auVar7,auVar5);
    local_28e0 = vpunpckhqdq_avx2(auVar7,auVar5);
    local_2800 = vperm2i128_avx2(local_2880,local_28a0,0x20);
    local_2840 = vperm2i128_avx2(local_2880,local_28a0,0x31);
    local_2820 = vperm2i128_avx2(local_28c0,local_28e0,0x20);
    local_2860 = vperm2i128_avx2(local_28c0,local_28e0,0x31);
    if (local_239c != 0xf) {
      uVar45 = (short)(1 << ((byte)local_239c & 0x1f)) - 1;
      auVar1 = vpinsrw_avx(ZEXT216(uVar45),(uint)uVar45,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,6);
      auVar1 = vpinsrw_avx(auVar1,(uint)uVar45,7);
      auVar2 = vpinsrw_avx(ZEXT216(uVar45),(uint)uVar45,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,7);
      local_b20 = auVar1._0_8_;
      uStack_b18 = auVar1._8_8_;
      uStack_b10 = auVar2._0_8_;
      uStack_b08 = auVar2._8_8_;
      local_2940 = local_b20;
      uStackY_2938 = uStack_b18;
      uStackY_2930 = uStack_b10;
      uStackY_2928 = uStack_b08;
      uVar45 = -(short)(1 << ((byte)local_239c & 0x1f));
      auVar2 = vpinsrw_avx(ZEXT216(uVar45),(uint)uVar45,1);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,2);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,3);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,4);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,5);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,6);
      auVar2 = vpinsrw_avx(auVar2,(uint)uVar45,7);
      auVar3 = vpinsrw_avx(ZEXT216(uVar45),(uint)uVar45,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)uVar45,7);
      local_2960 = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
      auStackY_2950 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      uStack_b50 = auStackY_2950._0_8_;
      uStack_b48 = auStackY_2950._8_8_;
      auVar36._16_8_ = uStack_b10;
      auVar36._0_16_ = auVar1;
      auVar36._24_8_ = uStack_b08;
      auVar5 = vpminsw_avx2(local_2880,auVar36);
      auVar35._16_8_ = uStack_b10;
      auVar35._0_16_ = auVar1;
      auVar35._24_8_ = uStack_b08;
      auVar6 = vpminsw_avx2(local_28a0,auVar35);
      auVar34._16_8_ = uStack_b10;
      auVar34._0_16_ = auVar1;
      auVar34._24_8_ = uStack_b08;
      auVar7 = vpminsw_avx2(local_28c0,auVar34);
      auVar33._16_8_ = uStack_b10;
      auVar33._0_16_ = auVar1;
      auVar33._24_8_ = uStack_b08;
      auVar8 = vpminsw_avx2(local_28e0,auVar33);
      auVar40._16_8_ = uStack_b50;
      auVar40._0_16_ = local_2960;
      auVar40._24_8_ = uStack_b48;
      local_2880 = vpmaxsw_avx2(auVar5,auVar40);
      auVar39._16_8_ = uStack_b50;
      auVar39._0_16_ = local_2960;
      auVar39._24_8_ = uStack_b48;
      local_28a0 = vpmaxsw_avx2(auVar6,auVar39);
      auVar38._16_8_ = uStack_b50;
      auVar38._0_16_ = local_2960;
      auVar38._24_8_ = uStack_b48;
      local_28c0 = vpmaxsw_avx2(auVar7,auVar38);
      auVar37._16_8_ = uStack_b50;
      auVar37._0_16_ = local_2960;
      auVar37._24_8_ = uStack_b48;
      local_28e0 = vpmaxsw_avx2(auVar8,auVar37);
    }
    uVar41 = local_2800._8_8_;
    uVar42 = local_2800._16_8_;
    uVar43 = local_2800._24_8_;
    local_2180 = local_2590;
    uStackY_2178 = uStackY_2588;
    local_2170 = local_2550;
    uStackY_2168 = uStackY_2548;
    local_2160 = local_2570;
    uStackY_2158 = uStackY_2568;
    local_2150 = local_2530;
    uStackY_2148 = uStackY_2528;
    local_2140 = local_25a0;
    uStackY_2138 = uStackY_2598;
    local_2130 = local_2580;
    uStackY_2128 = uStackY_2578;
    local_2120 = local_2560;
    uStackY_2118 = uStackY_2558;
    local_2110 = local_2540;
    uStackY_2108 = uStackY_2538;
    local_2080 = local_2590;
    uStackY_2078 = uStackY_2588;
    local_2070 = local_2550;
    uStackY_2068 = uStackY_2548;
    local_2060 = local_2570;
    uStackY_2058 = uStackY_2568;
    local_2050 = local_2530;
    uStackY_2048 = uStackY_2528;
    local_2040 = local_25a0;
    uStackY_2038 = uStackY_2598;
    local_2030 = local_2580;
    uStackY_2028 = uStackY_2578;
    local_2020 = local_2560;
    uStackY_2018 = uStackY_2558;
    local_2010 = local_2540;
    uStackY_2008 = uStackY_2538;
    *local_2390 = local_2800._0_8_;
    puVar44[1] = uVar41;
    puVar44[2] = uVar42;
    puVar44[3] = uVar43;
    puVar44 = local_2390;
    uVar41 = local_2820._8_8_;
    uVar42 = local_2820._16_8_;
    uVar43 = local_2820._24_8_;
    local_2390[4] = local_2820._0_8_;
    puVar44[5] = uVar41;
    puVar44[6] = uVar42;
    puVar44[7] = uVar43;
    puVar44 = local_2390;
    uVar41 = local_2840._8_8_;
    uVar42 = local_2840._16_8_;
    uVar43 = local_2840._24_8_;
    local_2390[8] = local_2840._0_8_;
    puVar44[9] = uVar41;
    puVar44[10] = uVar42;
    puVar44[0xb] = uVar43;
    puVar44 = local_2390;
    uVar41 = local_2860._8_8_;
    uVar42 = local_2860._16_8_;
    uVar43 = local_2860._24_8_;
    local_2390[0xc] = local_2860._0_8_;
    puVar44[0xd] = uVar41;
    puVar44[0xe] = uVar42;
    puVar44[0xf] = uVar43;
    local_2390 = local_2390 + 0x10;
    local_2904 = local_2904 + 8;
  }
  dct2_butterfly_h16_avx2
            (in_stack_ffffffffffffe418,in_stack_ffffffffffffe414,in_stack_ffffffffffffe408,
             in_stack_ffffffffffffe404,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3fc);
  return;
}

Assistant:

void itrans_dct2_h8_w16_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 16]);
    dct2_butterfly_h8_avx2(src, 16, tmp, 16, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h16_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}